

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QWidgetTextControl * __thiscall
QGraphicsTextItemPrivate::textControl(QGraphicsTextItemPrivate *this)

{
  QGraphicsTextItemPrivate *this_00;
  ContextType *in_RDI;
  long in_FS_OFFSET;
  qreal qVar1;
  QGraphicsTextItem *that;
  QSizeF pgSize;
  undefined4 uVar2;
  TextInteractionFlag in_stack_fffffffffffffe9c;
  QRectF *in_stack_fffffffffffffea0;
  QWidgetTextControl *in_stack_fffffffffffffea8;
  QSizeF *in_stack_fffffffffffffeb0;
  QGraphicsItem *this_01;
  QObject *in_stack_fffffffffffffec8;
  Connection *pCVar3;
  QWidgetTextControl *in_stack_fffffffffffffed0;
  Object *in_stack_fffffffffffffef0;
  ContextType *in_stack_fffffffffffffef8;
  Object *in_stack_ffffffffffffff00;
  code *signal;
  offset_in_QWidgetTextControl_to_subr in_stack_ffffffffffffff20;
  code *signal_00;
  ConnectionType type;
  long lVar4;
  QRectF local_a0;
  QSizeF local_80;
  code *local_70;
  undefined8 local_68;
  Connection local_60;
  code *local_58;
  undefined8 local_50;
  Connection local_48;
  undefined8 local_40;
  Connection local_38;
  undefined8 local_30;
  Connection local_28;
  undefined8 local_20;
  Connection local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)&in_RDI->super_QGraphicsObject == 0) {
    lVar4 = *(long *)&in_RDI[1].super_QGraphicsObject.field_0x8;
    this_00 = (QGraphicsTextItemPrivate *)operator_new(0x18);
    QWidgetTextControl::QWidgetTextControl(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    *(QGraphicsTextItemPrivate **)&in_RDI->super_QGraphicsObject = this_00;
    this_01 = *(QGraphicsItem **)&in_RDI->super_QGraphicsObject;
    QFlags<Qt::TextInteractionFlag>::QFlags
              ((QFlags<Qt::TextInteractionFlag> *)in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe9c);
    QWidgetTextControl::setTextInteractionFlags
              (in_stack_fffffffffffffea8,
               (QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)SUB84((ulong)this_00 >> 0x20,0));
    local_20 = *(undefined8 *)(lVar4 + 0x20);
    type = 0x711ba0;
    pCVar3 = local_18;
    QObject::
    connect<void(QWidgetTextControl::*)(QRectF_const&),QGraphicsTextItemPrivate::textControl()const::__0>
              (in_stack_ffffffffffffff00,in_stack_ffffffffffffff20,in_stack_fffffffffffffef8,
               (anon_class_8_1_3fcf653e_for_o *)in_stack_fffffffffffffef0,(ConnectionType)lVar4);
    QMetaObject::Connection::~Connection(pCVar3);
    local_30 = *(undefined8 *)(lVar4 + 0x20);
    signal_00 = QWidgetTextControl::documentSizeChanged;
    pCVar3 = &local_28;
    QObject::
    connect<void(QWidgetTextControl::*)(QSizeF_const&),QGraphicsTextItemPrivate::textControl()const::__1>
              (in_stack_ffffffffffffff00,
               (offset_in_QWidgetTextControl_to_subr)QWidgetTextControl::documentSizeChanged,
               in_stack_fffffffffffffef8,(anon_class_8_1_3fcf653e_for_o *)in_stack_fffffffffffffef0,
               (ConnectionType)lVar4);
    QMetaObject::Connection::~Connection(pCVar3);
    local_40 = *(undefined8 *)(lVar4 + 0x20);
    signal = QWidgetTextControl::visibilityRequest;
    QObject::
    connect<void(QWidgetTextControl::*)(QRectF_const&),QGraphicsTextItemPrivate::textControl()const::__2>
              (in_stack_ffffffffffffff00,(offset_in_QWidgetTextControl_to_subr)signal_00,
               in_stack_fffffffffffffef8,(anon_class_8_1_3fcf653e_for_o *)in_stack_fffffffffffffef0,
               (ConnectionType)lVar4);
    QMetaObject::Connection::~Connection(&local_38);
    local_58 = QGraphicsTextItem::linkActivated;
    local_50 = 0;
    pCVar3 = &local_48;
    QObject::
    connect<void(QWidgetTextControl::*)(QString_const&),void(QGraphicsTextItem::*)(QString_const&)>
              (in_stack_fffffffffffffef0,(offset_in_QWidgetTextControl_to_subr)signal,in_RDI,
               (offset_in_QGraphicsTextItem_to_subr *)pCVar3,type);
    QMetaObject::Connection::~Connection(pCVar3);
    local_70 = QGraphicsTextItem::linkHovered;
    local_68 = 0;
    uVar2 = 0;
    QObject::
    connect<void(QWidgetTextControl::*)(QString_const&),void(QGraphicsTextItem::*)(QString_const&)>
              ((Object *)QWidgetTextControl::linkHovered,
               (offset_in_QWidgetTextControl_to_subr)signal,in_RDI,
               (offset_in_QGraphicsTextItem_to_subr *)pCVar3,type);
    QMetaObject::Connection::~Connection(&local_60);
    local_80.wd = -NAN;
    local_80.ht = -NAN;
    QWidgetTextControl::document((QWidgetTextControl *)in_stack_fffffffffffffea0);
    local_80.wd = (qreal)QTextDocument::pageSize();
    qVar1 = QSizeF::height(&local_80);
    if ((qVar1 != -1.0) || (NAN(qVar1))) {
      QGraphicsItem::prepareGeometryChange((QGraphicsItem *)in_RDI);
      QRectF::setSize(in_stack_fffffffffffffea0,(QSizeF *)CONCAT44(in_stack_fffffffffffffe9c,uVar2))
      ;
      QRectF::QRectF(&local_a0);
      QGraphicsItem::update(this_01,(QRectF *)this_00);
    }
    else {
      QWidgetTextControl::size((QWidgetTextControl *)in_stack_fffffffffffffea0);
      _q_updateBoundingRect(this_00,in_stack_fffffffffffffeb0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(QWidgetTextControl **)&in_RDI->super_QGraphicsObject;
}

Assistant:

QWidgetTextControl *QGraphicsTextItemPrivate::textControl() const
{
    if (!control) {
        QGraphicsTextItem *that = const_cast<QGraphicsTextItem *>(qq);
        control = new QWidgetTextControl(that);
        control->setTextInteractionFlags(Qt::NoTextInteraction);

        QObject::connect(control, &QWidgetTextControl::updateRequest, qq,
                         [dd = that->dd](const QRectF &rect) { dd->_q_update(rect); });
        QObject::connect(control, &QWidgetTextControl::documentSizeChanged, qq,
                         [dd = that->dd](QSizeF size) { dd->_q_updateBoundingRect(size); });
        QObject::connect(control, &QWidgetTextControl::visibilityRequest, qq,
                         [dd = that->dd](const QRectF &rect) { dd->_q_ensureVisible(rect); });
        QObject::connect(control, &QWidgetTextControl::linkActivated, qq,
                         &QGraphicsTextItem::linkActivated);
        QObject::connect(control, &QWidgetTextControl::linkHovered, qq,
                         &QGraphicsTextItem::linkHovered);

        const QSizeF pgSize = control->document()->pageSize();
        if (pgSize.height() != -1) {
            qq->prepareGeometryChange();
            that->dd->boundingRect.setSize(pgSize);
            qq->update();
        } else {
            that->dd->_q_updateBoundingRect(control->size());
        }
    }
    return control;
}